

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O0

void __thiscall capnp::TextCodec::decode(TextCodec *this,StringPtr input,Builder output)

{
  anon_class_16_2_fed2076e f;
  TextCodec *this_local;
  StringPtr input_local;
  
  input_local.content.ptr = (char *)input.content.size_;
  this_local = (TextCodec *)input.content.ptr;
  f.output = &output;
  f.input = (StringPtr *)&this_local;
  capnp::(anonymous_namespace)::
  lexAndParseExpression<capnp::TextCodec::decode(kj::StringPtr,capnp::DynamicStruct::Builder)const::__0>
            (input,f);
  return;
}

Assistant:

void TextCodec::decode(kj::StringPtr input, DynamicStruct::Builder output) const {
  lexAndParseExpression(input, [&](compiler::Expression::Reader expression) {
    KJ_REQUIRE(expression.isTuple(), "Input does not contain a struct.") { return; }

    ThrowingErrorReporter errorReporter(input);
    ExternalResolver nullResolver;

    Orphanage orphanage = Orphanage::getForMessageContaining(output);
    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    translator.fillStructValue(output, expression.getTuple());
  });
}